

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableSetColumnWidth(int column_n,float width)

{
  float fVar1;
  uint uVar2;
  ImGuiTable *table;
  ImGuiTableColumn *pIVar3;
  ImGuiTableColumn *pIVar4;
  ImGuiTableColumn *pIVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  
  table = GImGui->CurrentTable;
  pIVar3 = (table->Columns).Data;
  fVar8 = table->MinColumnWidth;
  fVar7 = TableGetMaxColumnWidth(table,column_n);
  fVar7 = (float)(-(uint)(fVar7 <= fVar8) & (uint)fVar8 | ~-(uint)(fVar7 <= fVar8) & (uint)fVar7);
  if (width <= fVar7) {
    fVar7 = width;
  }
  fVar7 = (float)(-(uint)(width < fVar8) & (uint)fVar8 | ~-(uint)(width < fVar8) & (uint)fVar7);
  if ((pIVar3[column_n].WidthGiven != fVar7) || (NAN(pIVar3[column_n].WidthGiven) || NAN(fVar7))) {
    pIVar5 = pIVar3 + column_n;
    fVar1 = pIVar5->WidthRequest;
    if ((fVar1 != fVar7) || (NAN(fVar1) || NAN(fVar7))) {
      pIVar4 = (ImGuiTableColumn *)0x0;
      if ((long)pIVar5->NextEnabledColumn != -1) {
        pIVar4 = pIVar3 + pIVar5->NextEnabledColumn;
      }
      uVar2 = pIVar5->Flags;
      if (((uVar2 & 8) == 0) ||
         (((pIVar4 != (ImGuiTableColumn *)0x0 && ((long)table->LeftMostStretchedColumn != -1)) &&
          (pIVar3[table->LeftMostStretchedColumn].DisplayOrder < pIVar5->DisplayOrder)))) {
        if (pIVar4 == (ImGuiTableColumn *)0x0) {
          if ((long)pIVar5->PrevEnabledColumn == -1) {
            pIVar4 = (ImGuiTableColumn *)0x0;
          }
          else {
            pIVar4 = pIVar3 + pIVar5->PrevEnabledColumn;
          }
        }
        if (pIVar4 == (ImGuiTableColumn *)0x0) {
          return;
        }
        fVar7 = pIVar4->WidthRequest - (fVar7 - fVar1);
        uVar6 = -(uint)(fVar8 <= fVar7);
        fVar8 = (float)(~uVar6 & (uint)fVar8 | (uint)fVar7 & uVar6);
        pIVar5->WidthRequest = (fVar1 + pIVar4->WidthRequest) - fVar8;
        pIVar4->WidthRequest = fVar8;
        if (((uVar2 | pIVar4->Flags) & 4) != 0) {
          TableUpdateColumnsWeightFromWidth(table);
        }
      }
      else {
        pIVar5->WidthRequest = fVar7;
      }
      table->IsSettingsDirty = true;
    }
  }
  return;
}

Assistant:

void ImGui::TableSetColumnWidth(int column_n, float width)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && table->IsLayoutLocked == false);
    IM_ASSERT(column_n >= 0 && column_n < table->ColumnsCount);
    ImGuiTableColumn* column_0 = &table->Columns[column_n];
    float column_0_width = width;

    // Apply constraints early
    // Compare both requested and actual given width to avoid overwriting requested width when column is stuck (minimum size, bounded)
    IM_ASSERT(table->MinColumnWidth > 0.0f);
    const float min_width = table->MinColumnWidth;
    const float max_width = ImMax(min_width, TableGetMaxColumnWidth(table, column_n));
    column_0_width = ImClamp(column_0_width, min_width, max_width);
    if (column_0->WidthGiven == column_0_width || column_0->WidthRequest == column_0_width)
        return;

    //IMGUI_DEBUG_LOG("TableSetColumnWidth(%d, %.1f->%.1f)\n", column_0_idx, column_0->WidthGiven, column_0_width);
    ImGuiTableColumn* column_1 = (column_0->NextEnabledColumn != -1) ? &table->Columns[column_0->NextEnabledColumn] : NULL;

    // In this surprisingly not simple because of how we support mixing Fixed and multiple Stretch columns.
    // - All fixed: easy.
    // - All stretch: easy.
    // - One or more fixed + one stretch: easy.
    // - One or more fixed + more than one stretch: tricky.
    // Qt when manual resize is enabled only support a single _trailing_ stretch column.

    // When forwarding resize from Wn| to Fn+1| we need to be considerate of the _NoResize flag on Fn+1.
    // FIXME-TABLE: Find a way to rewrite all of this so interactions feel more consistent for the user.
    // Scenarios:
    // - F1 F2 F3  resize from F1| or F2|   --> ok: alter ->WidthRequested of Fixed column. Subsequent columns will be offset.
    // - F1 F2 F3  resize from F3|          --> ok: alter ->WidthRequested of Fixed column. If active, ScrollX extent can be altered.
    // - F1 F2 W3  resize from F1| or F2|   --> ok: alter ->WidthRequested of Fixed column. If active, ScrollX extent can be altered, but it doesn't make much sense as the Stretch column will always be minimal size.
    // - F1 F2 W3  resize from W3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 W2 W3  resize from W1| or W2|   --> ok
    // - W1 W2 W3  resize from W3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 F2 F3  resize from F3|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 F2     resize from F2|          --> ok: no-op (disabled by Resize Rule 1)
    // - W1 W2 F3  resize from W1| or W2|   --> ok
    // - W1 F2 W3  resize from W1| or F2|   --> ok
    // - F1 W2 F3  resize from W2|          --> ok
    // - F1 W3 F2  resize from W3|          --> ok
    // - W1 F2 F3  resize from W1|          --> ok: equivalent to resizing |F2. F3 will not move.
    // - W1 F2 F3  resize from F2|          --> ok
    // All resizes from a Wx columns are locking other columns.

    // Possible improvements:
    // - W1 W2 W3  resize W1|               --> to not be stuck, both W2 and W3 would stretch down. Seems possible to fix. Would be most beneficial to simplify resize of all-weighted columns.
    // - W3 F1 F2  resize W3|               --> to not be stuck past F1|, both F1 and F2 would need to stretch down, which would be lossy or ambiguous. Seems hard to fix.

    // [Resize Rule 1] Can't resize from right of right-most visible column if there is any Stretch column. Implemented in TableUpdateLayout().

    // If we have all Fixed columns OR resizing a Fixed column that doesn't come after a Stretch one, we can do an offsetting resize.
    // This is the preferred resize path
    if (column_0->Flags & ImGuiTableColumnFlags_WidthFixed)
        if (!column_1 || table->LeftMostStretchedColumn == -1 || table->Columns[table->LeftMostStretchedColumn].DisplayOrder >= column_0->DisplayOrder)
        {
            column_0->WidthRequest = column_0_width;
            table->IsSettingsDirty = true;
            return;
        }

    // We can also use previous column if there's no next one (this is used when doing an auto-fit on the right-most stretch column)
    if (column_1 == NULL)
        column_1 = (column_0->PrevEnabledColumn != -1) ? &table->Columns[column_0->PrevEnabledColumn] : NULL;
    if (column_1 == NULL)
        return;

    // Resizing from right-side of a Stretch column before a Fixed column forward sizing to left-side of fixed column.
    // (old_a + old_b == new_a + new_b) --> (new_a == old_a + old_b - new_b)
    float column_1_width = ImMax(column_1->WidthRequest - (column_0_width - column_0->WidthRequest), min_width);
    column_0_width = column_0->WidthRequest + column_1->WidthRequest - column_1_width;
    IM_ASSERT(column_0_width > 0.0f && column_1_width > 0.0f);
    column_0->WidthRequest = column_0_width;
    column_1->WidthRequest = column_1_width;
    if ((column_0->Flags | column_1->Flags) & ImGuiTableColumnFlags_WidthStretch)
        TableUpdateColumnsWeightFromWidth(table);
    table->IsSettingsDirty = true;
}